

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  RayQueryContext *pRVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  size_t bits;
  AccelData *pAVar5;
  ulong uVar6;
  ulong extraout_RAX;
  uint i;
  long lVar7;
  NodeRef *pNVar8;
  undefined4 uVar9;
  int iVar10;
  RayQueryContext *in_R8;
  RayQueryContext *in_R9;
  NodeRef nodeRef;
  RayQueryContext *pRVar11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar12;
  RayQueryContext *pRVar13;
  bool bVar14;
  float fVar15;
  float fVar24;
  float fVar25;
  vint4 bi;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar26;
  undefined1 auVar19 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  float fVar29;
  float fVar34;
  float fVar35;
  vint4 bi_1;
  float fVar36;
  undefined1 auVar30 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  float fVar39;
  float fVar40;
  vint4 ai;
  float fVar41;
  undefined1 auVar38 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  vint4 ai_1;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar52;
  float fVar53;
  vint4 ai_3;
  undefined1 auVar51 [16];
  float fVar54;
  uint uVar56;
  uint uVar57;
  vint4 bi_2;
  uint uVar58;
  undefined1 auVar55 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  vint4 bi_3;
  float fVar62;
  uint uVar63;
  uint uVar66;
  uint uVar67;
  vint4 ai_2;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  float fVar72;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar80;
  float fVar81;
  undefined1 auVar79 [16];
  float fVar82;
  float fVar83;
  float fVar85;
  float fVar86;
  undefined1 in_XMM12 [16];
  undefined1 auVar84 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 in_XMM13 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid_leaf;
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  pAVar5 = This->ptr;
  pRVar11 = *(RayQueryContext **)&pAVar5[1].bounds.bounds0.lower.field_0;
  if (pRVar11 != (RayQueryContext *)0x8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pAVar5 = (AccelData *)context->args,
       ((ulong)(pAVar5->super_RefCount)._vptr_RefCount & 0x10000) != 0)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar22._8_4_ = 0xffffffff;
    auVar22._0_8_ = 0xffffffffffffffff;
    auVar22._12_4_ = 0xffffffff;
    auVar65._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
    auVar65._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
    auVar65._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
    auVar65._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
    iVar3 = movmskps((int)pAVar5,auVar65);
    uVar6 = CONCAT44((int)((ulong)pAVar5 >> 0x20),iVar3);
    if (iVar3 != 0) {
      auVar21 = *(undefined1 (*) [16])(ray + 0x40);
      fVar42 = (float)DAT_01f80d30;
      fVar44 = DAT_01f80d30._4_4_;
      fVar46 = DAT_01f80d30._8_4_;
      fVar48 = DAT_01f80d30._12_4_;
      auVar16._4_4_ = -(uint)(ABS(auVar21._4_4_) < fVar44);
      auVar16._0_4_ = -(uint)(ABS(auVar21._0_4_) < fVar42);
      auVar16._8_4_ = -(uint)(ABS(auVar21._8_4_) < fVar46);
      auVar16._12_4_ = -(uint)(ABS(auVar21._12_4_) < fVar48);
      auVar51 = blendvps(auVar21,_DAT_01f80d30,auVar16);
      auVar16 = *(undefined1 (*) [16])(ray + 0x50);
      auVar17._4_4_ = -(uint)(ABS(auVar16._4_4_) < fVar44);
      auVar17._0_4_ = -(uint)(ABS(auVar16._0_4_) < fVar42);
      auVar17._8_4_ = -(uint)(ABS(auVar16._8_4_) < fVar46);
      auVar17._12_4_ = -(uint)(ABS(auVar16._12_4_) < fVar48);
      auVar73 = blendvps(auVar16,_DAT_01f80d30,auVar17);
      auVar17 = *(undefined1 (*) [16])(ray + 0x60);
      auVar84._4_4_ = -(uint)(ABS(auVar17._4_4_) < fVar44);
      auVar84._0_4_ = -(uint)(ABS(auVar17._0_4_) < fVar42);
      auVar84._8_4_ = -(uint)(ABS(auVar17._8_4_) < fVar46);
      auVar84._12_4_ = -(uint)(ABS(auVar17._12_4_) < fVar48);
      auVar79 = blendvps(auVar17,_DAT_01f80d30,auVar84);
      auVar84 = rcpps(in_XMM12,auVar51);
      fVar83 = auVar84._0_4_;
      fVar85 = auVar84._4_4_;
      fVar86 = auVar84._8_4_;
      fVar87 = auVar84._12_4_;
      auVar84 = rcpps(in_XMM13,auVar73);
      fVar88 = auVar84._0_4_;
      auVar74._0_4_ = auVar73._0_4_ * fVar88;
      fVar89 = auVar84._4_4_;
      auVar74._4_4_ = auVar73._4_4_ * fVar89;
      fVar90 = auVar84._8_4_;
      auVar74._8_4_ = auVar73._8_4_ * fVar90;
      fVar91 = auVar84._12_4_;
      auVar74._12_4_ = auVar73._12_4_ * fVar91;
      auVar84 = rcpps(auVar74,auVar79);
      fVar72 = auVar84._0_4_;
      fVar75 = auVar84._4_4_;
      fVar76 = auVar84._8_4_;
      fVar77 = auVar84._12_4_;
      auVar64._0_8_ =
           CONCAT44(-(uint)(auVar21._4_4_ < 0.0),-(uint)(auVar21._0_4_ < 0.0)) & 0x100000001;
      auVar64._8_4_ = -(uint)(auVar21._8_4_ < 0.0) & 1;
      auVar64._12_4_ = -(uint)(auVar21._12_4_ < 0.0) & 1;
      auVar73._0_8_ =
           CONCAT44(-(uint)(auVar16._4_4_ < 0.0),-(uint)(auVar16._0_4_ < 0.0)) & 0x200000002;
      auVar73._8_4_ = -(uint)(auVar16._8_4_ < 0.0) & 2;
      auVar73._12_4_ = -(uint)(auVar16._12_4_ < 0.0) & 2;
      fVar78 = *(float *)ray;
      fVar80 = *(float *)(ray + 4);
      fVar81 = *(float *)(ray + 8);
      fVar82 = *(float *)(ray + 0xc);
      fVar42 = *(float *)(ray + 0x10);
      fVar44 = *(float *)(ray + 0x14);
      fVar46 = *(float *)(ray + 0x18);
      fVar48 = *(float *)(ray + 0x1c);
      fVar92 = *(float *)(ray + 0x20);
      fVar93 = *(float *)(ray + 0x24);
      fVar94 = *(float *)(ray + 0x28);
      fVar95 = *(float *)(ray + 0x2c);
      auVar21._8_4_ = -(uint)(auVar17._8_4_ < 0.0) & 4;
      auVar21._0_8_ =
           CONCAT44(-(uint)(auVar17._4_4_ < 0.0),-(uint)(auVar17._0_4_ < 0.0)) & 0x400000004;
      auVar21._12_4_ = -(uint)(auVar17._12_4_ < 0.0) & 4;
      local_1758 = auVar65 ^ auVar22 | auVar21 | auVar73 | auVar64;
      do {
        lVar7 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        iVar3 = *(int *)(local_1758 + lVar7 * 4);
        auVar18._0_4_ = -(uint)(iVar3 == local_1758._0_4_);
        auVar18._4_4_ = -(uint)(iVar3 == local_1758._4_4_);
        auVar18._8_4_ = -(uint)(iVar3 == local_1758._8_4_);
        auVar18._12_4_ = -(uint)(iVar3 == local_1758._12_4_);
        uVar9 = movmskps((int)lVar7,auVar18);
        uVar6 = uVar6 & ~CONCAT44((int)((ulong)lVar7 >> 0x20),uVar9);
      } while (uVar6 != 0);
      auVar27._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
      auVar27._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
      auVar27._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
      auVar27._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
      auVar65 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      iVar3 = (int)DAT_01f7a9f0;
      iVar69 = DAT_01f7a9f0._4_4_;
      iVar70 = DAT_01f7a9f0._8_4_;
      iVar71 = DAT_01f7a9f0._12_4_;
      local_16e8.v = (__m128)blendvps(_DAT_01f7a9f0,auVar65,auVar27);
      local_1758._8_4_ = 0xffffffff;
      local_1758._0_8_ = 0xffffffffffffffff;
      local_1758._12_4_ = 0xffffffff;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = (size_t)pRVar11;
      stack_near[1].field_0 = local_16e8;
      if (pRVar11 != (RayQueryContext *)&DAT_fffffffffffffff8) {
        fVar83 = fVar83 + (1.0 - auVar51._0_4_ * fVar83) * fVar83;
        fVar85 = fVar85 + (1.0 - auVar51._4_4_ * fVar85) * fVar85;
        fVar86 = fVar86 + (1.0 - auVar51._8_4_ * fVar86) * fVar86;
        fVar87 = fVar87 + (1.0 - auVar51._12_4_ * fVar87) * fVar87;
        fVar88 = fVar88 + (1.0 - auVar74._0_4_) * fVar88;
        fVar89 = fVar89 + (1.0 - auVar74._4_4_) * fVar89;
        fVar90 = fVar90 + (1.0 - auVar74._8_4_) * fVar90;
        fVar91 = fVar91 + (1.0 - auVar74._12_4_) * fVar91;
        fVar72 = fVar72 + (1.0 - auVar79._0_4_ * fVar72) * fVar72;
        fVar75 = fVar75 + (1.0 - auVar79._4_4_ * fVar75) * fVar75;
        fVar76 = fVar76 + (1.0 - auVar79._8_4_ * fVar76) * fVar76;
        fVar77 = fVar77 + (1.0 - auVar79._12_4_ * fVar77) * fVar77;
        pNVar8 = stack_node + 1;
        auVar65 = maxps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa10);
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       blendvps(_DAT_01f7aa00,auVar65,auVar27);
        paVar12 = &stack_near[2].field_0;
        local_16f8 = fVar83;
        fStack_16f4 = fVar85;
        fStack_16f0 = fVar86;
        fStack_16ec = fVar87;
        local_1708 = fVar88;
        fStack_1704 = fVar89;
        fStack_1700 = fVar90;
        fStack_16fc = fVar91;
        local_1718 = fVar72;
        fStack_1714 = fVar75;
        fStack_1710 = fVar76;
        fStack_170c = fVar77;
        local_1728 = fVar78;
        fStack_1724 = fVar80;
        fStack_1720 = fVar81;
        fStack_171c = fVar82;
        local_1738 = fVar42;
        fStack_1734 = fVar44;
        fStack_1730 = fVar46;
        fStack_172c = fVar48;
        local_1748 = fVar92;
        fStack_1744 = fVar93;
        fStack_1740 = fVar94;
        fStack_173c = fVar95;
        uVar6 = 0;
        do {
          aVar31 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar12[-1].v;
          paVar12 = paVar12 + -1;
          auVar51._4_4_ = -(uint)(aVar31.v[1] < (float)bi_8.field_0.i[1]);
          auVar51._0_4_ = -(uint)(aVar31.v[0] < (float)bi_8.field_0.i[0]);
          auVar51._8_4_ = -(uint)(aVar31.v[2] < (float)bi_8.field_0.i[2]);
          auVar51._12_4_ = -(uint)(aVar31._12_4_ < (float)bi_8.field_0.i[3]);
          uVar4 = movmskps((int)uVar6,auVar51);
          uVar6 = (ulong)uVar4;
          if (uVar4 != 0) {
            while (pRVar13 = pRVar11, ((ulong)pRVar13 & 8) == 0) {
              lVar7 = 0;
              uVar6 = 0;
              aVar28.i[1] = iVar69;
              aVar28.i[0] = iVar3;
              aVar28.i[2] = iVar70;
              aVar28.i[3] = iVar71;
              pRVar11 = (RayQueryContext *)0x8;
              do {
                pRVar1 = *(RayQueryContext **)(((ulong)pRVar13 & 0xfffffffffffffff0) + lVar7 * 8);
                aVar31 = aVar28;
                if (pRVar1 == (RayQueryContext *)0x8) break;
                fVar62 = *(float *)((long)&pRVar13[1].user + lVar7 * 4);
                fVar26 = *(float *)((long)&pRVar13[2].scene + lVar7 * 4);
                fVar15 = *(float *)((long)&pRVar13[2].args + lVar7 * 4);
                fVar36 = *(float *)((long)&pRVar13[3].user + lVar7 * 4);
                fVar37 = (fVar62 - fVar78) * fVar83;
                fVar39 = (fVar62 - fVar80) * fVar85;
                fVar40 = (fVar62 - fVar81) * fVar86;
                fVar41 = (fVar62 - fVar82) * fVar87;
                fVar43 = (fVar15 - fVar42) * fVar88;
                fVar45 = (fVar15 - fVar44) * fVar89;
                fVar47 = (fVar15 - fVar46) * fVar90;
                fVar49 = (fVar15 - fVar48) * fVar91;
                fVar62 = *(float *)((long)&pRVar13[4].scene + lVar7 * 4);
                fVar50 = (fVar62 - fVar92) * fVar72;
                fVar52 = (fVar62 - fVar93) * fVar75;
                fVar53 = (fVar62 - fVar94) * fVar76;
                fVar54 = (fVar62 - fVar95) * fVar77;
                fVar15 = (fVar26 - fVar78) * fVar83;
                fVar24 = (fVar26 - fVar80) * fVar85;
                fVar25 = (fVar26 - fVar81) * fVar86;
                fVar26 = (fVar26 - fVar82) * fVar87;
                fVar29 = (fVar36 - fVar42) * fVar88;
                fVar34 = (fVar36 - fVar44) * fVar89;
                fVar35 = (fVar36 - fVar46) * fVar90;
                fVar36 = (fVar36 - fVar48) * fVar91;
                fVar62 = *(float *)((long)&pRVar13[4].args + lVar7 * 4);
                fVar59 = (fVar62 - fVar92) * fVar72;
                fVar60 = (fVar62 - fVar93) * fVar75;
                fVar61 = (fVar62 - fVar94) * fVar76;
                fVar62 = (fVar62 - fVar95) * fVar77;
                uVar4 = (uint)((int)fVar15 < (int)fVar37) * (int)fVar15 |
                        (uint)((int)fVar15 >= (int)fVar37) * (int)fVar37;
                uVar56 = (uint)((int)fVar24 < (int)fVar39) * (int)fVar24 |
                         (uint)((int)fVar24 >= (int)fVar39) * (int)fVar39;
                uVar57 = (uint)((int)fVar25 < (int)fVar40) * (int)fVar25 |
                         (uint)((int)fVar25 >= (int)fVar40) * (int)fVar40;
                uVar58 = (uint)((int)fVar26 < (int)fVar41) * (int)fVar26 |
                         (uint)((int)fVar26 >= (int)fVar41) * (int)fVar41;
                uVar63 = (uint)((int)fVar29 < (int)fVar43) * (int)fVar29 |
                         (uint)((int)fVar29 >= (int)fVar43) * (int)fVar43;
                uVar66 = (uint)((int)fVar34 < (int)fVar45) * (int)fVar34 |
                         (uint)((int)fVar34 >= (int)fVar45) * (int)fVar45;
                uVar67 = (uint)((int)fVar35 < (int)fVar47) * (int)fVar35 |
                         (uint)((int)fVar35 >= (int)fVar47) * (int)fVar47;
                uVar68 = (uint)((int)fVar36 < (int)fVar49) * (int)fVar36 |
                         (uint)((int)fVar36 >= (int)fVar49) * (int)fVar49;
                uVar63 = ((int)uVar63 < (int)uVar4) * uVar4 | ((int)uVar63 >= (int)uVar4) * uVar63;
                uVar66 = ((int)uVar66 < (int)uVar56) * uVar56 |
                         ((int)uVar66 >= (int)uVar56) * uVar66;
                uVar67 = ((int)uVar67 < (int)uVar57) * uVar57 |
                         ((int)uVar67 >= (int)uVar57) * uVar67;
                uVar68 = ((int)uVar68 < (int)uVar58) * uVar58 |
                         ((int)uVar68 >= (int)uVar58) * uVar68;
                uVar4 = (uint)((int)fVar59 < (int)fVar50) * (int)fVar59 |
                        (uint)((int)fVar59 >= (int)fVar50) * (int)fVar50;
                uVar56 = (uint)((int)fVar60 < (int)fVar52) * (int)fVar60 |
                         (uint)((int)fVar60 >= (int)fVar52) * (int)fVar52;
                uVar57 = (uint)((int)fVar61 < (int)fVar53) * (int)fVar61 |
                         (uint)((int)fVar61 >= (int)fVar53) * (int)fVar53;
                uVar58 = (uint)((int)fVar62 < (int)fVar54) * (int)fVar62 |
                         (uint)((int)fVar62 >= (int)fVar54) * (int)fVar54;
                auVar55._0_4_ =
                     ((int)uVar4 < (int)uVar63) * uVar63 | ((int)uVar4 >= (int)uVar63) * uVar4;
                auVar55._4_4_ =
                     ((int)uVar56 < (int)uVar66) * uVar66 | ((int)uVar56 >= (int)uVar66) * uVar56;
                auVar55._8_4_ =
                     ((int)uVar57 < (int)uVar67) * uVar67 | ((int)uVar57 >= (int)uVar67) * uVar57;
                auVar55._12_4_ =
                     ((int)uVar58 < (int)uVar68) * uVar68 | ((int)uVar58 >= (int)uVar68) * uVar58;
                uVar4 = (uint)((int)fVar15 < (int)fVar37) * (int)fVar37 |
                        (uint)((int)fVar15 >= (int)fVar37) * (int)fVar15;
                uVar56 = (uint)((int)fVar24 < (int)fVar39) * (int)fVar39 |
                         (uint)((int)fVar24 >= (int)fVar39) * (int)fVar24;
                uVar57 = (uint)((int)fVar25 < (int)fVar40) * (int)fVar40 |
                         (uint)((int)fVar25 >= (int)fVar40) * (int)fVar25;
                uVar58 = (uint)((int)fVar26 < (int)fVar41) * (int)fVar41 |
                         (uint)((int)fVar26 >= (int)fVar41) * (int)fVar26;
                uVar63 = (uint)((int)fVar29 < (int)fVar43) * (int)fVar43 |
                         (uint)((int)fVar29 >= (int)fVar43) * (int)fVar29;
                uVar66 = (uint)((int)fVar34 < (int)fVar45) * (int)fVar45 |
                         (uint)((int)fVar34 >= (int)fVar45) * (int)fVar34;
                uVar67 = (uint)((int)fVar35 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar35 >= (int)fVar47) * (int)fVar35;
                uVar68 = (uint)((int)fVar36 < (int)fVar49) * (int)fVar49 |
                         (uint)((int)fVar36 >= (int)fVar49) * (int)fVar36;
                uVar4 = ((int)uVar4 < (int)uVar63) * uVar4 | ((int)uVar4 >= (int)uVar63) * uVar63;
                uVar56 = ((int)uVar56 < (int)uVar66) * uVar56 |
                         ((int)uVar56 >= (int)uVar66) * uVar66;
                uVar57 = ((int)uVar57 < (int)uVar67) * uVar57 |
                         ((int)uVar57 >= (int)uVar67) * uVar67;
                uVar58 = ((int)uVar58 < (int)uVar68) * uVar58 |
                         ((int)uVar58 >= (int)uVar68) * uVar68;
                uVar63 = (uint)((int)fVar59 < (int)fVar50) * (int)fVar50 |
                         (uint)((int)fVar59 >= (int)fVar50) * (int)fVar59;
                uVar66 = (uint)((int)fVar60 < (int)fVar52) * (int)fVar52 |
                         (uint)((int)fVar60 >= (int)fVar52) * (int)fVar60;
                uVar67 = (uint)((int)fVar61 < (int)fVar53) * (int)fVar53 |
                         (uint)((int)fVar61 >= (int)fVar53) * (int)fVar61;
                uVar68 = (uint)((int)fVar62 < (int)fVar54) * (int)fVar54 |
                         (uint)((int)fVar62 >= (int)fVar54) * (int)fVar62;
                uVar63 = (uint)(bi_8.field_0.i[0] < (int)uVar63) * bi_8.field_0.i[0] |
                         (bi_8.field_0.i[0] >= (int)uVar63) * uVar63;
                uVar66 = (uint)(bi_8.field_0.i[1] < (int)uVar66) * bi_8.field_0.i[1] |
                         (bi_8.field_0.i[1] >= (int)uVar66) * uVar66;
                uVar67 = (uint)(bi_8.field_0.i[2] < (int)uVar67) * bi_8.field_0.i[2] |
                         (bi_8.field_0.i[2] >= (int)uVar67) * uVar67;
                uVar68 = (uint)(bi_8.field_0.i[3] < (int)uVar68) * bi_8.field_0.i[3] |
                         (bi_8.field_0.i[3] >= (int)uVar68) * uVar68;
                auVar79._4_4_ =
                     -(uint)((float)((uint)((int)auVar55._4_4_ < (int)local_16e8._4_4_) *
                                     local_16e8._4_4_ |
                                    ((int)auVar55._4_4_ >= (int)local_16e8._4_4_) * auVar55._4_4_)
                            <= (float)(((int)uVar56 < (int)uVar66) * uVar56 |
                                      ((int)uVar56 >= (int)uVar66) * uVar66));
                auVar79._0_4_ =
                     -(uint)((float)((uint)((int)auVar55._0_4_ < (int)local_16e8._0_4_) *
                                     local_16e8._0_4_ |
                                    ((int)auVar55._0_4_ >= (int)local_16e8._0_4_) * auVar55._0_4_)
                            <= (float)(((int)uVar4 < (int)uVar63) * uVar4 |
                                      ((int)uVar4 >= (int)uVar63) * uVar63));
                auVar79._8_4_ =
                     -(uint)((float)((uint)((int)auVar55._8_4_ < (int)local_16e8._8_4_) *
                                     local_16e8._8_4_ |
                                    ((int)auVar55._8_4_ >= (int)local_16e8._8_4_) * auVar55._8_4_)
                            <= (float)(((int)uVar57 < (int)uVar67) * uVar57 |
                                      ((int)uVar57 >= (int)uVar67) * uVar67));
                auVar79._12_4_ =
                     -(uint)((float)((uint)((int)auVar55._12_4_ < (int)local_16e8._12_4_) *
                                     local_16e8._12_4_ |
                                    ((int)auVar55._12_4_ >= (int)local_16e8._12_4_) * auVar55._12_4_
                                    ) <=
                            (float)(((int)uVar58 < (int)uVar68) * uVar58 |
                                   ((int)uVar58 >= (int)uVar68) * uVar68));
                uVar4 = movmskps((int)in_R8,auVar79);
                in_R8 = (RayQueryContext *)(ulong)uVar4;
                if (uVar4 != 0) {
                  auVar30._4_4_ = iVar69;
                  auVar30._0_4_ = iVar3;
                  auVar30._8_4_ = iVar70;
                  auVar30._12_4_ = iVar71;
                  aVar31 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps(auVar30,auVar55,auVar79);
                  auVar19._4_4_ = -(uint)(aVar31.v[1] < aVar28.v[1]);
                  auVar19._0_4_ = -(uint)(aVar31.v[0] < aVar28.v[0]);
                  auVar19._8_4_ = -(uint)(aVar31.v[2] < aVar28.v[2]);
                  auVar19._12_4_ = -(uint)(aVar31.v[3] < aVar28.v[3]);
                  iVar10 = movmskps(uVar4,auVar19);
                  in_R8 = pRVar1;
                  aVar20 = aVar31;
                  if ((iVar10 == 0) ||
                     (bVar14 = pRVar11 != (RayQueryContext *)0x8, in_R8 = pRVar11, pRVar11 = pRVar1,
                     aVar20 = aVar28, aVar28 = aVar31, bVar14)) {
                    aVar31 = aVar28;
                    uVar6 = uVar6 + 1;
                    pNVar8->ptr = (size_t)in_R8;
                    pNVar8 = pNVar8 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar12->v = aVar20;
                    paVar12 = paVar12 + 1;
                  }
                }
                lVar7 = lVar7 + 1;
                aVar28 = aVar31;
              } while (lVar7 != 4);
              in_R9 = pRVar13;
              if (pRVar11 == (RayQueryContext *)0x8) goto LAB_00243b72;
              if (1 < uVar6) {
                auVar65 = *(undefined1 (*) [16])paVar12[-2].v;
                auVar22 = *(undefined1 (*) [16])paVar12[-1].v;
                auVar32._4_4_ = -(uint)(auVar65._4_4_ < auVar22._4_4_);
                auVar32._0_4_ = -(uint)(auVar65._0_4_ < auVar22._0_4_);
                auVar32._8_4_ = -(uint)(auVar65._8_4_ < auVar22._8_4_);
                auVar32._12_4_ = -(uint)(auVar65._12_4_ < auVar22._12_4_);
                uVar4 = movmskps((int)in_R8,auVar32);
                in_R8 = (RayQueryContext *)(ulong)uVar4;
                auVar21 = auVar22;
                if (uVar4 != 0) {
                  *(undefined1 (*) [16])paVar12[-2].v = auVar22;
                  *(undefined1 (*) [16])paVar12[-1].v = auVar65;
                  auVar21 = *(undefined1 (*) [16])(pNVar8 + -2);
                  auVar33._0_8_ = auVar21._8_8_;
                  auVar33._8_4_ = auVar21._0_4_;
                  auVar33._12_4_ = auVar21._4_4_;
                  *(undefined1 (*) [16])(pNVar8 + -2) = auVar33;
                  auVar21 = auVar65;
                  auVar65 = auVar22;
                }
                if (uVar6 != 2) {
                  auVar22 = *(undefined1 (*) [16])paVar12[-3].v;
                  auVar2._4_4_ = -(uint)(auVar22._4_4_ < auVar21._4_4_);
                  auVar2._0_4_ = -(uint)(auVar22._0_4_ < auVar21._0_4_);
                  auVar2._8_4_ = -(uint)(auVar22._8_4_ < auVar21._8_4_);
                  auVar2._12_4_ = -(uint)(auVar22._12_4_ < auVar21._12_4_);
                  uVar4 = movmskps((int)uVar6,auVar2);
                  uVar6 = (ulong)uVar4;
                  if (uVar4 != 0) {
                    *(undefined1 (*) [16])paVar12[-3].v = auVar21;
                    *(undefined1 (*) [16])paVar12[-1].v = auVar22;
                    uVar6 = pNVar8[-3].ptr;
                    in_R8 = (RayQueryContext *)pNVar8[-1].ptr;
                    pNVar8[-3].ptr = (size_t)in_R8;
                    pNVar8[-1].ptr = uVar6;
                    auVar22 = auVar21;
                  }
                  auVar38._4_4_ = -(uint)(auVar22._4_4_ < auVar65._4_4_);
                  auVar38._0_4_ = -(uint)(auVar22._0_4_ < auVar65._0_4_);
                  auVar38._8_4_ = -(uint)(auVar22._8_4_ < auVar65._8_4_);
                  auVar38._12_4_ = -(uint)(auVar22._12_4_ < auVar65._12_4_);
                  uVar4 = movmskps((int)uVar6,auVar38);
                  uVar6 = (ulong)uVar4;
                  if (uVar4 != 0) {
                    *(undefined1 (*) [16])paVar12[-3].v = auVar65;
                    *(undefined1 (*) [16])paVar12[-2].v = auVar22;
                    auVar65 = *(undefined1 (*) [16])(pNVar8 + -3);
                    auVar23._0_8_ = auVar65._8_8_;
                    auVar23._8_4_ = auVar65._0_4_;
                    auVar23._12_4_ = auVar65._4_4_;
                    *(undefined1 (*) [16])(pNVar8 + -3) = auVar23;
                  }
                }
              }
            }
            if (pRVar13 == (RayQueryContext *)&DAT_fffffffffffffff8) {
              return;
            }
            valid_leaf.field_0.i[1] = -(uint)(aVar31.v[1] < (float)bi_8.field_0.i[1]);
            valid_leaf.field_0.i[0] = -(uint)(aVar31.v[0] < (float)bi_8.field_0.i[0]);
            valid_leaf.field_0.i[2] = -(uint)(aVar31.v[2] < (float)bi_8.field_0.i[2]);
            valid_leaf.field_0.i[3] = -(uint)(aVar31.v[3] < (float)bi_8.field_0.i[3]);
            uVar4 = movmskps((int)uVar6,(undefined1  [16])valid_leaf.field_0);
            uVar6 = (ulong)uVar4;
            if (uVar4 != 0) {
              lVar7 = (ulong)((uint)pRVar13 & 0xf) - 8;
              if (lVar7 != 0) {
                pRVar13 = (RayQueryContext *)((ulong)pRVar13 & 0xfffffffffffffff0);
                do {
                  in_R8 = pRVar13;
                  InstanceArrayIntersectorK<4>::intersect
                            ((InstanceArrayIntersectorK<4> *)&valid_leaf,(vbool<4> *)&pre,
                             (Precalculations *)ray,(RayHitK<4> *)context,pRVar13,
                             (Primitive_conflict4 *)in_R9);
                  pRVar13 = (RayQueryContext *)&pRVar13->user;
                  lVar7 = lVar7 + -1;
                } while (lVar7 != 0);
                iVar3 = 0x7f800000;
                iVar69 = 0x7f800000;
                iVar70 = 0x7f800000;
                iVar71 = 0x7f800000;
                uVar6 = extraout_RAX;
                fVar42 = local_1738;
                fVar44 = fStack_1734;
                fVar46 = fStack_1730;
                fVar48 = fStack_172c;
                fVar92 = local_1748;
                fVar93 = fStack_1744;
                fVar94 = fStack_1740;
                fVar95 = fStack_173c;
                fVar72 = local_1718;
                fVar75 = fStack_1714;
                fVar76 = fStack_1710;
                fVar77 = fStack_170c;
                fVar78 = local_1728;
                fVar80 = fStack_1724;
                fVar81 = fStack_1720;
                fVar82 = fStack_171c;
                fVar83 = local_16f8;
                fVar85 = fStack_16f4;
                fVar86 = fStack_16f0;
                fVar87 = fStack_16ec;
                fVar88 = local_1708;
                fVar89 = fStack_1704;
                fVar90 = fStack_1700;
                fVar91 = fStack_16fc;
              }
              bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                             blendvps((undefined1  [16])bi_8.field_0,
                                      *(undefined1 (*) [16])(ray + 0x80),
                                      (undefined1  [16])valid_leaf.field_0);
            }
          }
LAB_00243b72:
          pRVar11 = (RayQueryContext *)pNVar8[-1].ptr;
          pNVar8 = pNVar8 + -1;
        } while (pRVar11 != (RayQueryContext *)&DAT_fffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }